

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paths.cc
# Opt level: O2

void InstallLib(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *targets)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  InLocalPath file;
  InLocalPath path;
  allocator local_c0 [32];
  InLocalPath local_a0;
  InLocalPath local_68;
  
  std::__cxx11::string::string((string *)&local_a0,"lib",local_c0);
  InLocalPath::InLocalPath(&local_68,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  pbVar1 = (targets->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (targets->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    InLocalPath::InLocalPath(&local_a0,pbVar3);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Installing library ");
    Path::Working_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)local_c0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)local_c0);
    InLocalPath::~InLocalPath(&local_a0);
  }
  InLocalPath::~InLocalPath(&local_68);
  return;
}

Assistant:

void InstallLib(const std::vector<std::string>& targets) {
  InLocalPath path("lib");
  for (const auto& target : targets) {
    InLocalPath file(target);
    std::cerr << "Installing library " << Path::Working() << std::endl;
  }
}